

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tables.cpp
# Opt level: O0

void __thiscall MT32Emu::Tables::Tables(Tables *this)

{
  float fVar1;
  double dVar2;
  int local_30;
  uint local_2c;
  int i_2;
  int i_1;
  int i;
  int masterVol;
  int lf_1;
  int val;
  float fVal;
  int lf;
  Tables *this_local;
  
  for (val = 0; val < 0x65; val = val + 1) {
    fVar1 = LOG10F((float)val + 1.0);
    masterVol = (int)((2.0 - fVar1) * 128.0 + 1.0);
    if (0xff < masterVol) {
      masterVol = 0xff;
    }
    this->levelToAmpSubtraction[val] = (Bit8u)masterVol;
  }
  this->envLogarithmicTime[0] = '@';
  for (i = 1; i < 0x100; i = i + 1) {
    fVar1 = LOG2F((float)i);
    dVar2 = ceil((double)(fVar1 * 8.0 + 64.0));
    this->envLogarithmicTime[i] = (Bit8u)(int)dVar2;
  }
  this->masterVolToAmpSubtraction[0] = 0xff;
  for (i_1 = 1; i_1 < 0x65; i_1 = i_1 + 1) {
    fVar1 = LOG2F((float)i_1);
    this->masterVolToAmpSubtraction[i_1] = (Bit8u)(int)(fVar1 * -16.0 + 106.31);
  }
  for (i_2 = 0; i_2 < 0x65; i_2 = i_2 + 1) {
    this->pulseWidth100To255[i_2] = (Bit8u)(int)((float)(i_2 * 0xff) / 100.0 + 0.5);
  }
  for (local_2c = 0; (int)local_2c < 0x200; local_2c = local_2c + 1) {
    fVar1 = EXP2F((float)(int)~local_2c * 0.001953125 + 13.0);
    this->exp9[(int)local_2c] = (Bit16u)(int)(8191.5 - fVar1);
  }
  for (local_30 = 1; local_30 < 0x200; local_30 = local_30 + 1) {
    dVar2 = sin((double)(((float)local_30 + 0.5) * 0.0009765625 * 3.1415927));
    fVar1 = LOG2F((float)dVar2);
    this->logsin9[local_30] = (Bit16u)(int)(0.5 - fVar1 * 1024.0);
  }
  this->logsin9[0] = 0x1fff;
  this->resAmpDecayFactor = "\x1f\x10\f\b\x05\x03\x02\x01";
  return;
}

Assistant:

Tables::Tables() {
	for (int lf = 0; lf <= 100; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		float fVal = (2.0f - LOG10F(float(lf) + 1.0f)) * 128.0f;
		int val = int(fVal + 1.0);
		if (val > 255) {
			val = 255;
		}
		levelToAmpSubtraction[lf] = Bit8u(val);
	}

	envLogarithmicTime[0] = 64;
	for (int lf = 1; lf <= 255; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		envLogarithmicTime[lf] = Bit8u(ceil(64.0f + LOG2F(float(lf)) * 8.0f));
	}

#if 0
	// The table below is to be used in conjunction with emulation of VCA of newer generation units which is currently missing.
	// These relatively small values are rather intended to fine-tune the overall amplification of the VCA.
	// CONFIRMED: Based on a table found by Mok in the LAPC-I control ROM
	// Note that this matches the MT-32 table, but with the values clamped to a maximum of 8.
	memset(masterVolToAmpSubtraction, 8, 71);
	memset(masterVolToAmpSubtraction + 71, 7, 3);
	memset(masterVolToAmpSubtraction + 74, 6, 4);
	memset(masterVolToAmpSubtraction + 78, 5, 3);
	memset(masterVolToAmpSubtraction + 81, 4, 4);
	memset(masterVolToAmpSubtraction + 85, 3, 3);
	memset(masterVolToAmpSubtraction + 88, 2, 4);
	memset(masterVolToAmpSubtraction + 92, 1, 4);
	memset(masterVolToAmpSubtraction + 96, 0, 5);
#else
	// CONFIRMED: Based on a table found by Mok in the MT-32 control ROM
	masterVolToAmpSubtraction[0] = 255;
	for (int masterVol = 1; masterVol <= 100; masterVol++) {
		masterVolToAmpSubtraction[masterVol] = Bit8u(106.31 - 16.0f * LOG2F(float(masterVol)));
	}
#endif

	for (int i = 0; i <= 100; i++) {
		pulseWidth100To255[i] = Bit8u(i * 255 / 100.0f + 0.5f);
		//synth->printDebug("%d: %d", i, pulseWidth100To255[i]);
	}

	// The LA32 chip contains an exponent table inside. The table contains 12-bit integer values.
	// The actual table size is 512 rows. The 9 higher bits of the fractional part of the argument are used as a lookup address.
	// To improve the precision of computations, the lower bits are supposed to be used for interpolation as the LA32 chip also
	// contains another 512-row table with inverted differences between the main table values.
	for (int i = 0; i < 512; i++) {
		exp9[i] = Bit16u(8191.5f - EXP2F(13.0f + ~i / 512.0f));
	}

	// There is a logarithmic sine table inside the LA32 chip. The table contains 13-bit integer values.
	for (int i = 1; i < 512; i++) {
		logsin9[i] = Bit16u(0.5f - LOG2F(sin((i + 0.5f) / 1024.0f * FLOAT_PI)) * 1024.0f);
	}

	// The very first value is clamped to the maximum possible 13-bit integer
	logsin9[0] = 8191;

	// found from sample analysis
	static const Bit8u resAmpDecayFactorTable[] = {31, 16, 12, 8, 5, 3, 2, 1};
	resAmpDecayFactor = resAmpDecayFactorTable;
}